

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O1

void * Curl_uint_hash_get(uint_hash *h,uint id)

{
  void *pvVar1;
  uint_hash_entry *puVar2;
  
  if (h->table != (uint_hash_entry **)0x0) {
    pvVar1 = (void *)((ulong)id / (ulong)h->slots);
    puVar2 = (uint_hash_entry *)(h->table + (ulong)id % (ulong)h->slots);
    do {
      puVar2 = puVar2->next;
      if (puVar2 == (uint_hash_entry *)0x0) goto LAB_00161d77;
    } while (puVar2->id != id);
    pvVar1 = puVar2->value;
LAB_00161d77:
    if (puVar2 != (uint_hash_entry *)0x0) {
      return pvVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

void *Curl_uint_hash_get(struct uint_hash *h, unsigned int id)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->init == CURL_UINTHASHINIT);
  if(h->table) {
    struct uint_hash_entry *he;
    DEBUGASSERT(h->slots);
    he = CURL_UINT_HASH_SLOT(h, id);
    while(he) {
      if(id == he->id) {
        return he->value;
      }
      he = he->next;
    }
  }
  return NULL;
}